

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itersolv.c
# Opt level: O2

Vector * ChebyshevIter(QMatrix *A,Vector *x,Vector *b,int MaxIter,PrecondProcType PrecondProc,
                      double OmegaPrecond)

{
  Boolean BVar1;
  LASErrIdType LVar2;
  size_t Dim;
  Vector *pVVar3;
  Vector *pVVar4;
  int iVar5;
  double bNorm;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  double local_128;
  double local_120;
  double local_f8;
  Vector r;
  Vector p;
  Vector z;
  
  Q_Lock(A);
  V_Lock(x);
  V_Lock(b);
  Dim = Q_GetDim(A);
  V_Constr(&r,"r",Dim,Normal,True);
  V_Constr(&p,"p",Dim,Normal,True);
  if (PrecondProc == (PrecondProcType)0x0) {
    BVar1 = Q_KerDefined(A);
    if (BVar1 != False) goto LAB_001061f0;
  }
  else {
LAB_001061f0:
    V_Constr(&z,"z",Dim,Normal,True);
  }
  LVar2 = LASResult();
  if (LVar2 == LASOK) {
    bNorm = l2Norm_V(b);
    dVar6 = GetMaxEigenval(A,PrecondProc,OmegaPrecond);
    dVar7 = GetMinEigenval(A,PrecondProc,OmegaPrecond);
    dVar8 = l1Norm_V(x);
    auVar9._8_4_ = (int)(Dim >> 0x20);
    auVar9._0_8_ = Dim;
    auVar9._12_4_ = 0x45300000;
    pVVar3 = b;
    if (2.2250738585072014e-307 <=
        ABS(dVar8 / ((auVar9._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)Dim) - 4503599627370496.0)))) {
      BVar1 = Q_KerDefined(A);
      if (BVar1 != False) {
        OrthoRightKer_VQ(x,A);
      }
      pVVar3 = Mul_QV(A,x);
      pVVar3 = Sub_VV(b,pVVar3);
    }
    dVar8 = (dVar6 - dVar7) * 0.5;
    dVar6 = (dVar6 + dVar7) * 0.5;
    Asgn_VV(&r,pVVar3);
    if (PrecondProc == (PrecondProcType)0x0) {
      BVar1 = Q_KerDefined(A);
      if (BVar1 != False) goto LAB_0010633c;
      iVar5 = 0;
      local_128 = 0.0;
      local_120 = 0.0;
      dVar7 = local_128;
      while( true ) {
        local_128 = dVar7;
        dVar7 = l2Norm_V(&r);
        BVar1 = RTCResult(iVar5,dVar7,bNorm,ChebyshevIterId);
        if ((MaxIter <= iVar5) || (BVar1 != False)) break;
        if (iVar5 == 0) {
          pVVar3 = Mul_SV(1.0 / dVar6,&r);
          local_128 = 1.0;
          local_f8 = dVar6 / dVar8;
        }
        else {
          dVar7 = ((dVar6 + dVar6) / dVar8) * local_128;
          local_f8 = dVar7 - local_120;
          pVVar3 = Mul_SV(((2.0 / dVar8) * local_128) / local_f8,&r);
          pVVar4 = Mul_SV(dVar7 / local_f8 + -1.0,&p);
          pVVar3 = Add_VV(pVVar3,pVVar4);
        }
        iVar5 = iVar5 + 1;
        Asgn_VV(&p,pVVar3);
        AddAsgn_VV(x,&p);
        if (iVar5 < MaxIter) {
          pVVar3 = Mul_QV(A,x);
          pVVar3 = Sub_VV(b,pVVar3);
          Asgn_VV(&r,pVVar3);
        }
        dVar7 = local_f8;
        local_120 = local_128;
      }
    }
    else {
LAB_0010633c:
      iVar5 = 0;
      local_128 = 0.0;
      local_120 = 0.0;
      dVar7 = local_128;
      while( true ) {
        local_128 = dVar7;
        dVar7 = l2Norm_V(&r);
        BVar1 = RTCResult(iVar5,dVar7,bNorm,ChebyshevIterId);
        if ((BVar1 != False) || (MaxIter <= iVar5)) break;
        if (PrecondProc == (PrecondProcType)0x0) {
          Asgn_VV(&z,&r);
        }
        else {
          (*PrecondProc)(A,&z,&r,OmegaPrecond);
        }
        BVar1 = Q_KerDefined(A);
        if (BVar1 != False) {
          OrthoRightKer_VQ(&z,A);
        }
        if (iVar5 == 0) {
          pVVar3 = Mul_SV(1.0 / dVar6,&z);
          local_128 = 1.0;
          local_f8 = dVar6 / dVar8;
        }
        else {
          dVar7 = ((dVar6 + dVar6) / dVar8) * local_128;
          local_f8 = dVar7 - local_120;
          pVVar3 = Mul_SV(((2.0 / dVar8) * local_128) / local_f8,&z);
          pVVar4 = Mul_SV(dVar7 / local_f8 + -1.0,&p);
          pVVar3 = Add_VV(pVVar3,pVVar4);
        }
        iVar5 = iVar5 + 1;
        Asgn_VV(&p,pVVar3);
        AddAsgn_VV(x,&p);
        if (iVar5 < MaxIter) {
          pVVar3 = Mul_QV(A,x);
          pVVar3 = Sub_VV(b,pVVar3);
          Asgn_VV(&r,pVVar3);
        }
        dVar7 = local_f8;
        local_120 = local_128;
      }
    }
    BVar1 = Q_KerDefined(A);
    if (BVar1 != False) {
      OrthoRightKer_VQ(x,A);
    }
  }
  V_Destr(&r);
  V_Destr(&p);
  if (PrecondProc == (PrecondProcType)0x0) {
    BVar1 = Q_KerDefined(A);
    if (BVar1 == False) goto LAB_001066da;
  }
  V_Destr(&z);
LAB_001066da:
  Q_Unlock(A);
  V_Unlock(x);
  V_Unlock(b);
  return x;
}

Assistant:

Vector *ChebyshevIter(QMatrix *A, Vector *x, Vector *b, int MaxIter,
            PrecondProcType PrecondProc, double OmegaPrecond)
{
    /*
     *  for details to the algorithm see
     *
     *  R. Barrett, M. Berry, T. F. Chan, J. Demmel, J. Donato, J. Dongarra,
     *  V. Eijkhout, R. Pozo, Ch. Romine, H. van der Vorst:
     *  Templates for the Solution of Linear Systems: Building Blocks
     *  for Iterative Solvers;
     *  SIAM, Philadelphia, 1994
     *
     *  The original algorithm doesn't seem to work correctly.
     *  The three term recursion was therefore in the curent version
     *  adopted after
     *
     *  W. Hackbusch: 
     *  Iterative Solution of Large Sparse Systems of Equations,
     *  Springer-Verlag, Berlin, 1994
     *
     */
     
    int Iter;
    double MaxEigenval, MinEigenval;
    double c, d, Alpha, Beta;
    double T = 0.0, TOld = 0.0, TNew; /* values of Chebyshev polynomials */
    double bNorm;
    size_t Dim;
    Vector r, p, z;
    

    Q_Lock(A);
    V_Lock(x);
    V_Lock(b);
    
    Dim = Q_GetDim(A);
    V_Constr(&r, "r", Dim, Normal, True);
    V_Constr(&p, "p", Dim, Normal, True);
    if (PrecondProc != NULL || Q_KerDefined(A))
        V_Constr(&z, "z", Dim, Normal, True);

    if (LASResult() == LASOK) {
        bNorm = l2Norm_V(b);

        MaxEigenval = GetMaxEigenval(A, PrecondProc, OmegaPrecond);
        MinEigenval = GetMinEigenval(A, PrecondProc, OmegaPrecond);

        c = (MaxEigenval - MinEigenval) / 2.0;
        d = (MaxEigenval + MinEigenval) / 2.0;
	
        Iter = 0;
        /* r = b - A * x(i) */
        if (!IsZero(l1Norm_V(x) / Dim)) {
            if (Q_KerDefined(A))
	       OrthoRightKer_VQ(x, A);
            Asgn_VV(&r, Sub_VV(b, Mul_QV(A, x)));
        } else {
            Asgn_VV(&r, b);
	}
        if (PrecondProc != NULL || Q_KerDefined(A)) {
            /* preconditioned Chebyshev method */
            while (!RTCResult(Iter, l2Norm_V(&r), bNorm, ChebyshevIterId)
                && Iter < MaxIter) {
                Iter++;
		if (PrecondProc != NULL)
                    (*PrecondProc)(A, &z, &r, OmegaPrecond);
		else
		    Asgn_VV(&z, &r);
		if (Q_KerDefined(A))
		    OrthoRightKer_VQ(&z, A);
                if (Iter == 1) {
                    TOld = 1.0;
	            T = d / c;
                    Alpha = 1.0 / d;
                    Asgn_VV(&p, Mul_SV(Alpha, &z));
                } else {
		    TNew = 2.0 * d / c * T - TOld;
		    TOld = T;
		    T = TNew;
                    Alpha = 2.0 / c * TOld / T;
                    Beta = 2.0 * d / c * TOld / T - 1.0;
                    Asgn_VV(&p, Add_VV(Mul_SV(Alpha, &z), Mul_SV(Beta, &p)));
                }
                AddAsgn_VV(x, &p);
                if (Iter < MaxIter)
                    Asgn_VV(&r, Sub_VV(b, Mul_QV(A, x)));
            }
        } else {
            /* plain Chebyshev method (z = r) */
            while (!RTCResult(Iter, l2Norm_V(&r), bNorm, ChebyshevIterId)
                && Iter < MaxIter) {
                Iter++;
                if (Iter == 1) {
                    TOld = 1.0;
	            T = d / c;
                    Alpha = 1.0 / d;
                    Asgn_VV(&p, Mul_SV(Alpha, &r));
                } else {
		    TNew = 2.0 * d / c * T - TOld;
		    TOld = T;
		    T = TNew;
                    Alpha = 2.0 / c * TOld / T;
                    Beta = 2.0 * d / c * TOld / T - 1.0;
                    Asgn_VV(&p, Add_VV(Mul_SV(Alpha, &r), Mul_SV(Beta, &p)));
                }
                AddAsgn_VV(x, &p);
                if (Iter < MaxIter)
                    Asgn_VV(&r, Sub_VV(b, Mul_QV(A, x)));
            }
        }
        if (Q_KerDefined(A))
	   OrthoRightKer_VQ(x, A);
    }

    V_Destr(&r);
    V_Destr(&p);
    if (PrecondProc != NULL || Q_KerDefined(A))
        V_Destr(&z);

    Q_Unlock(A);
    V_Unlock(x);
    V_Unlock(b);

    return(x);
}